

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O0

void t6(void)

{
  int unaff_retaddr;
  int unaff_retaddr_00;
  int p;
  int t;
  int tp;
  char *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff4;
  int expect;
  int got;
  
  printf("Trigger tests.\n");
  gpio_write(0x19,0);
  got = 0;
  callback(0x19,2,t6cbf);
  time_sleep(0x3fc999999999999a);
  for (expect = 0; expect < 5; expect = expect + 1) {
    time_sleep(0x3fb999999999999a);
    in_stack_fffffffffffffff4 = expect * 10 + 10;
    got = in_stack_fffffffffffffff4 + got;
    gpio_trigger(0x19,in_stack_fffffffffffffff4,1);
  }
  time_sleep(0x3fe0000000000000);
  CHECK(unaff_retaddr_00,unaff_retaddr,got,expect,in_stack_fffffffffffffff4,
        in_stack_ffffffffffffffe8);
  CHECK(unaff_retaddr_00,unaff_retaddr,got,expect,in_stack_fffffffffffffff4,
        in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void t6()
{
   int tp, t, p;

   printf("Trigger tests.\n");

   gpio_write(GPIO, PI_LOW);

   tp = 0;

   callback(GPIO, EITHER_EDGE, t6cbf);

   time_sleep(0.2);

   for (t=0; t<5; t++)
   {
      time_sleep(0.1);
      p = 10 + (t*10);
      tp += p;
      gpio_trigger(GPIO, p, 1);
   }

   time_sleep(0.5);

   CHECK(6, 1, t6_count, 5, 0, "gpio trigger count");

   CHECK(6, 2, t6_on, tp, 25, "gpio trigger pulse length");
}